

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void vkt::synchronization::anon_unknown_0::ShaderAccess::initPassthroughPrograms
               (SourceCollections *programCollection,string *shaderPrefix,string *declCode,
               string *mainCode,VkShaderStageFlagBits stage)

{
  VkShaderStageFlags VVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_228;
  undefined1 local_208 [44];
  allocator<char> local_1dc;
  allocator<char> local_1db;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  allocator<char> local_1d8;
  allocator<char> local_1d7;
  allocator<char> local_1d6;
  allocator<char> local_1d5;
  allocator<char> local_1d4;
  allocator<char> local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  string *local_1d0;
  string local_1c8;
  ostringstream src;
  
  local_1d0 = mainCode;
  VVar1 = getRequiredStages(stage);
  if ((VVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)&src,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 v_in_position;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3,";\n");
    poVar3 = std::operator<<(poVar3,"\n");
    if ((stage & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_208,"",&local_1d1);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)local_208);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = v_in_position;\n");
    if ((stage & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&bStack_228,"",&local_1d2);
    }
    else {
      std::__cxx11::string::string((string *)&bStack_228,(string *)local_1d0);
    }
    poVar3 = std::operator<<(poVar3,(string *)&bStack_228);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)local_208);
    std::operator+(&bStack_228,shaderPrefix,"vert");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&bStack_228);
    std::__cxx11::stringbuf::str();
    glu::VertexSource::VertexSource((VertexSource *)local_208,&local_1c8);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_208);
    std::__cxx11::string::~string((string *)(local_208 + 8));
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar1 & 2) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)&src,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(vertices = 3) out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"in ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3," gl_in[gl_MaxPatchVertices];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3," gl_out[];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    if ((stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_208,"",&local_1d3);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)local_208);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[0] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[1] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[0] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[1] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[2] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[3] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    if ((stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&bStack_228,"",&local_1d4);
    }
    else {
      std::operator+(&bStack_228,"\n",local_1d0);
    }
    poVar3 = std::operator<<(poVar3,(string *)&bStack_228);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)local_208);
    std::operator+(&bStack_228,shaderPrefix,"tesc");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&bStack_228);
    std::__cxx11::stringbuf::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_208,&local_1c8);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_208);
    std::__cxx11::string::~string((string *)(local_208 + 8));
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar1 & 4) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)&src,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(triangles, equal_spacing, ccw) in;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"in ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3," gl_in[gl_MaxPatchVertices];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3,";\n");
    poVar3 = std::operator<<(poVar3,"\n");
    if ((stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_208,"",&local_1d5);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)local_208);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    vec3 px = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n");
    poVar3 = std::operator<<(poVar3,"    vec3 py = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n");
    poVar3 = std::operator<<(poVar3,"    vec3 pz = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = vec4(px + py + pz, 1.0);\n");
    if ((stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&bStack_228,"",&local_1d6);
    }
    else {
      std::__cxx11::string::string((string *)&bStack_228,(string *)local_1d0);
    }
    poVar3 = std::operator<<(poVar3,(string *)&bStack_228);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)local_208);
    std::operator+(&bStack_228,shaderPrefix,"tese");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&bStack_228);
    std::__cxx11::stringbuf::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_208,&local_1c8);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_208);
    std::__cxx11::string::~string((string *)(local_208 + 8));
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar1 & 8) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)&src,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(triangles) in;\n");
    poVar3 = std::operator<<(poVar3,"layout(triangle_strip, max_vertices = 3) out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"in ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3," gl_in[];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3,";\n");
    poVar3 = std::operator<<(poVar3,"\n");
    if ((stage & VK_SHADER_STAGE_GEOMETRY_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_208,"",&local_1d7);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)local_208);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = gl_in[0].gl_Position;\n");
    poVar3 = std::operator<<(poVar3,"    EmitVertex();\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = gl_in[1].gl_Position;\n");
    poVar3 = std::operator<<(poVar3,"    EmitVertex();\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = gl_in[2].gl_Position;\n");
    poVar3 = std::operator<<(poVar3,"    EmitVertex();\n");
    if ((stage & VK_SHADER_STAGE_GEOMETRY_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&bStack_228,"",&local_1d8);
    }
    else {
      std::operator+(&bStack_228,"\n",local_1d0);
    }
    poVar3 = std::operator<<(poVar3,(string *)&bStack_228);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)local_208);
    std::operator+(&bStack_228,shaderPrefix,"geom");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&bStack_228);
    std::__cxx11::stringbuf::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)local_208,&local_1c8);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_208);
    std::__cxx11::string::~string((string *)(local_208 + 8));
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar1 & 0x10) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)&src,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 o_color;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    if ((stage & VK_SHADER_STAGE_FRAGMENT_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_208,"",&local_1d9);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)local_208);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    o_color = vec4(1.0);\n");
    if ((stage & VK_SHADER_STAGE_FRAGMENT_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&bStack_228,"",&local_1da);
    }
    else {
      std::operator+(&bStack_228,"\n",local_1d0);
    }
    poVar3 = std::operator<<(poVar3,(string *)&bStack_228);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)local_208);
    std::operator+(&bStack_228,shaderPrefix,"frag");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&bStack_228);
    std::__cxx11::stringbuf::str();
    glu::FragmentSource::FragmentSource((FragmentSource *)local_208,&local_1c8);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_208);
    std::__cxx11::string::~string((string *)(local_208 + 8));
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar1 & 0x20) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)&src,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(local_size_x = 1) in;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    if ((stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_208,"",&local_1db);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)local_208);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    if ((stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&bStack_228,"",&local_1dc);
    }
    else {
      std::__cxx11::string::string((string *)&bStack_228,(string *)local_1d0);
    }
    poVar3 = std::operator<<(poVar3,(string *)&bStack_228);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)local_208);
    std::operator+(&bStack_228,shaderPrefix,"comp");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&bStack_228);
    std::__cxx11::stringbuf::str();
    glu::ComputeSource::ComputeSource((ComputeSource *)local_208,&local_1c8);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_208);
    std::__cxx11::string::~string((string *)(local_208 + 8));
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  return;
}

Assistant:

void initPassthroughPrograms (SourceCollections&			programCollection,
							  const std::string&			shaderPrefix,
							  const std::string&			declCode,
							  const std::string&			mainCode,
							  const VkShaderStageFlagBits	stage)
{
	const VkShaderStageFlags	requiredStages	= getRequiredStages(stage);

	if (requiredStages & VK_SHADER_STAGE_VERTEX_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 v_in_position;\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_VERTEX_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = v_in_position;\n"
			<< (stage & VK_SHADER_STAGE_VERTEX_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "vert") << glu::VertexSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = 1.0;\n"
			<< "    gl_TessLevelInner[1] = 1.0;\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = 1.0;\n"
			<< "    gl_TessLevelOuter[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[2] = 1.0;\n"
			<< "    gl_TessLevelOuter[3] = 1.0;\n"
			<< "\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "tesc") << glu::TessellationControlSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    vec3 px = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 py = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 pz = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(px + py + pz, 1.0);\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_GEOMETRY_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_GEOMETRY_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = gl_in[0].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[1].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[2].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< (stage & VK_SHADER_STAGE_GEOMETRY_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "geom") << glu::GeometrySource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_FRAGMENT_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_FRAGMENT_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(1.0);\n"
			<< (stage & VK_SHADER_STAGE_FRAGMENT_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "frag") << glu::FragmentSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_COMPUTE_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(local_size_x = 1) in;\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_COMPUTE_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (stage & VK_SHADER_STAGE_COMPUTE_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "comp") << glu::ComputeSource(src.str());
	}
}